

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O0

void __thiscall leveldb::DBConstructor::NewDB(DBConstructor *this)

{
  bool bVar1;
  Message *pMVar2;
  char *pcVar3;
  char *in_R9;
  string local_198;
  AssertHelper local_178;
  string local_170;
  Message local_150;
  bool local_141;
  undefined1 local_140 [8];
  AssertionResult gtest_ar__1;
  string local_120;
  AssertHelper local_100;
  string local_f8;
  Message local_d8;
  bool local_c9;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_;
  Status status;
  Options options;
  undefined1 local_30 [8];
  string name;
  DBConstructor *this_local;
  
  name.field_2._8_8_ = this;
  testing::TempDir_abi_cxx11_();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &options.filter_policy,"table_testdb");
  std::__cxx11::string::~string((string *)&options.filter_policy);
  Options::Options((Options *)&status);
  status.state_ = (char *)this->comparator_;
  DestroyDB((leveldb *)&gtest_ar_.message_,(string *)local_30,(Options *)&status);
  local_c9 = Status::ok((Status *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_c8,&local_c9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    Status::ToString_abi_cxx11_(&local_f8,(Status *)&gtest_ar_.message_);
    pMVar2 = testing::Message::operator<<(&local_d8,&local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_120,(internal *)local_c8,(AssertionResult *)"status.ok()","false","true",in_R9
              );
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/table/table_test.cc"
               ,0x168,pcVar3);
    testing::internal::AssertHelper::operator=(&local_100,pMVar2);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_f8);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  if (bVar1) {
    options.comparator._0_1_ = 1;
    options.comparator._1_1_ = 1;
    options.info_log = (Logger *)0x2710;
    DB::Open((DB *)&gtest_ar__1.message_,(Options *)&status,(string *)local_30,&this->db_);
    Status::operator=((Status *)&gtest_ar_.message_,(Status *)&gtest_ar__1.message_);
    Status::~Status((Status *)&gtest_ar__1.message_);
    local_141 = Status::ok((Status *)&gtest_ar_.message_);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_140,&local_141,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
    if (!bVar1) {
      testing::Message::Message(&local_150);
      Status::ToString_abi_cxx11_(&local_170,(Status *)&gtest_ar_.message_);
      pMVar2 = testing::Message::operator<<(&local_150,&local_170);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_198,(internal *)local_140,(AssertionResult *)"status.ok()","false","true",
                 in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_178,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/table/table_test.cc"
                 ,0x16e,pcVar3);
      testing::internal::AssertHelper::operator=(&local_178,pMVar2);
      testing::internal::AssertHelper::~AssertHelper(&local_178);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_170);
      testing::Message::~Message(&local_150);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  }
  Status::~Status((Status *)&gtest_ar_.message_);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void NewDB() {
    std::string name = testing::TempDir() + "table_testdb";

    Options options;
    options.comparator = comparator_;
    Status status = DestroyDB(name, options);
    ASSERT_TRUE(status.ok()) << status.ToString();

    options.create_if_missing = true;
    options.error_if_exists = true;
    options.write_buffer_size = 10000;  // Something small to force merging
    status = DB::Open(options, name, &db_);
    ASSERT_TRUE(status.ok()) << status.ToString();
  }